

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_GetSuperProperty<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  InlineCacheIndex inlineCacheIndex;
  FunctionBody *functionBody;
  bool bVar1;
  PropertyId PVar2;
  Var pvVar3;
  Var pvVar4;
  InlineCache *pIVar5;
  RecyclableObject *object;
  RecyclableObject *instance;
  uint localRegisterID;
  undefined1 local_90 [8];
  PropertyValueInfo info;
  Var value;
  
  pvVar3 = GetReg<unsigned_int>(this,playout->Instance);
  pvVar4 = GetReg<unsigned_int>(this,playout->Value2);
  pIVar5 = GetInlineCache(this,playout->PropertyIdIndex);
  PVar2 = GetPropertyIdFromCacheId(this,playout->PropertyIdIndex);
  bVar1 = VarIs<Js::RecyclableObject>(pvVar3);
  if (bVar1) {
    bVar1 = VarIs<Js::RecyclableObject>(pvVar4);
    if (bVar1) {
      object = VarTo<Js::RecyclableObject>(pvVar3);
      instance = VarTo<Js::RecyclableObject>(pvVar4);
      local_90 = (undefined1  [8])0x0;
      info.m_instance = (RecyclableObject *)0x50000ffff;
      info.m_propertyIndex = 0;
      info.m_attributes = '\0';
      info.flags = InlineCacheNoFlags;
      info.cacheInfoFlag = 0;
      info.inlineCache = (InlineCache *)0x0;
      info.prop = (RecyclableObject *)0x0;
      info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
      info.functionBody = (FunctionBody *)0x0;
      info.propertyRecordUsageCache._0_4_ = 0xffffffff;
      info.propertyRecordUsageCache._5_1_ = 1;
      PropertyValueInfo::SetCacheInfo
                ((PropertyValueInfo *)local_90,*(FunctionBody **)(this + 0x88),pIVar5,
                 playout->PropertyIdIndex,true);
      bVar1 = CacheOperators::
              TryGetProperty<true,false,false,false,false,false,true,false,false,false>
                        (instance,false,object,PVar2,(Var *)&info.inlineCacheIndex,
                         *(ScriptContext **)(this + 0x78),(PropertyCacheOperationInfo *)0x0,
                         (PropertyValueInfo *)local_90);
      if (bVar1) {
        localRegisterID = playout->Value;
        goto LAB_00960ae9;
      }
    }
  }
  functionBody = *(FunctionBody **)(this + 0x88);
  localRegisterID = playout->Value;
  pIVar5 = GetInlineCache(this,playout->PropertyIdIndex);
  inlineCacheIndex = playout->PropertyIdIndex;
  pvVar3 = GetReg<unsigned_int>(this,playout->Instance);
  PVar2 = GetPropertyIdFromCacheId(this,playout->PropertyIdIndex);
  pvVar4 = GetReg<unsigned_int>(this,playout->Value2);
  info._56_8_ = JavascriptOperators::PatchGetValueWithThisPtr<false,Js::InlineCache>
                          (functionBody,pIVar5,inlineCacheIndex,pvVar3,PVar2,pvVar4);
LAB_00960ae9:
  SetReg<unsigned_int>(this,localRegisterID,(Var)info._56_8_);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetSuperProperty(unaligned T* playout)
    {
        // Same fast path as in the backend.
        Var instance = GetReg(playout->Instance);
        Var thisInstance = GetReg(playout->Value2);
        InlineCache *inlineCache = GetInlineCache(playout->PropertyIdIndex);
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->PropertyIdIndex);
        if (VarIs<RecyclableObject>(instance) && VarIs<RecyclableObject>(thisInstance))
        {
            RecyclableObject* superObj = VarTo<RecyclableObject>(instance);
            RecyclableObject* thisObj = VarTo<RecyclableObject>(thisInstance);
            PropertyValueInfo info;
            PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->PropertyIdIndex, true);

            Var value;
            if (CacheOperators::TryGetProperty<true, false, false, false, false, false, true, false, false, false>(
                thisObj, false, superObj, propertyId, &value, GetScriptContext(), nullptr, &info))
            {
                SetReg(playout->Value, value);
                return;
            }
        }
        SetReg(
            playout->Value,
            JavascriptOperators::PatchGetValueWithThisPtr<false>(
                GetFunctionBody(),
                GetInlineCache(playout->PropertyIdIndex),
                playout->PropertyIdIndex,
                GetReg(playout->Instance),
                GetPropertyIdFromCacheId(playout->PropertyIdIndex),
                GetReg(playout->Value2)));
    }